

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_test.cc
# Opt level: O0

void re2::SetEmptyAnchored(void)

{
  bool bVar1;
  size_type sVar2;
  ostream *poVar3;
  LogMessage local_b50;
  LogMessage local_9d0;
  StringPiece local_850;
  LogMessage local_840;
  LogMessage local_6c0;
  StringPiece local_540;
  undefined1 local_530 [8];
  vector<int,_std::allocator<int>_> v;
  StringPiece local_398;
  LogMessage local_388;
  StringPiece local_208;
  LogMessage local_1f8;
  Options local_68;
  undefined1 local_50 [8];
  Set s;
  
  RE2::Options::Options(&local_68,DefaultOptions);
  RE2::Set::Set((Set *)local_50,&local_68,ANCHOR_BOTH);
  bVar1 = RE2::Set::Compile((Set *)local_50);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x8c);
    poVar3 = LogMessage::stream(&local_1f8);
    std::operator<<(poVar3,"Check failed: (s.Compile()) == (true)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1f8);
  }
  StringPiece::StringPiece(&local_208,"");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_208,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_388,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x8e);
    poVar3 = LogMessage::stream(&local_388);
    std::operator<<(poVar3,"Check failed: (s.Match(\"\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_388);
  }
  StringPiece::StringPiece(&local_398,"foobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_398,(vector<int,_std::allocator<int>_> *)0x0);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x8f);
    poVar3 = LogMessage::stream((LogMessage *)
                                &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
    std::operator<<(poVar3,"Check failed: (s.Match(\"foobar\", __null)) == (false)");
    LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)
               &v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_530);
  StringPiece::StringPiece(&local_540,"");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_540,(vector<int,_std::allocator<int>_> *)local_530)
  ;
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_6c0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x92);
    poVar3 = LogMessage::stream(&local_6c0);
    std::operator<<(poVar3,"Check failed: (s.Match(\"\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6c0);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_530);
  if (sVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_840,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x93);
    poVar3 = LogMessage::stream(&local_840);
    std::operator<<(poVar3,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_840);
  }
  StringPiece::StringPiece(&local_850,"foobar");
  bVar1 = RE2::Set::Match((Set *)local_50,&local_850,(vector<int,_std::allocator<int>_> *)local_530)
  ;
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_9d0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x95);
    poVar3 = LogMessage::stream(&local_9d0);
    std::operator<<(poVar3,"Check failed: (s.Match(\"foobar\", &v)) == (false)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_9d0);
  }
  sVar2 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_530);
  if (sVar2 != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b50,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/set_test.cc"
               ,0x96);
    poVar3 = LogMessage::stream(&local_b50);
    std::operator<<(poVar3,"Check failed: (v.size()) == (0)");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b50);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_530);
  RE2::Set::~Set((Set *)local_50);
  return;
}

Assistant:

TEST(Set, EmptyAnchored) {
  RE2::Set s(RE2::DefaultOptions, RE2::ANCHOR_BOTH);

  CHECK_EQ(s.Compile(), true);

  CHECK_EQ(s.Match("", NULL), false);
  CHECK_EQ(s.Match("foobar", NULL), false);

  vector<int> v;
  CHECK_EQ(s.Match("", &v), false);
  CHECK_EQ(v.size(), 0);

  CHECK_EQ(s.Match("foobar", &v), false);
  CHECK_EQ(v.size(), 0);
}